

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O1

ostringstream * toml::detail::format_filename(ostringstream *oss,source_location *loc)

{
  ostream *poVar1;
  char local_19;
  
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,"\x1b[01m",5);
  }
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,"\x1b[34m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss," --> ",5);
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,"\x1b[00m",5);
  }
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,"\x1b[01m",5);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)oss,(loc->file_name_)._M_dataplus._M_p,
                      (loc->file_name_)._M_string_length);
  local_19 = '\n';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
  if (color::ansi::detail::color_status()::status == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[00m",5);
  }
  return oss;
}

Assistant:

TOML11_INLINE std::ostringstream&
format_filename(std::ostringstream& oss, const source_location& loc)
{
    // --> example.toml
    oss << color::bold << color::blue << " --> " << color::reset
        << color::bold << loc.file_name() << '\n' << color::reset;
    return oss;
}